

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

void __thiscall
duckdb::HashAggregateFinalizeTask::HashAggregateFinalizeTask
          (HashAggregateFinalizeTask *this,ClientContext *context,Pipeline *pipeline,
          shared_ptr<duckdb::Event,_true> *event_p,PhysicalHashAggregate *op,
          HashAggregateGlobalSinkState *state_p)

{
  Executor *executor_p;
  shared_ptr<duckdb::Event,_true> local_38;
  
  executor_p = pipeline->executor;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ExecutorTask::ExecutorTask(&this->super_ExecutorTask,executor_p,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ExecutorTask).super_Task._vptr_Task = (_func_int **)&PTR__ExecutorTask_02499808;
  this->context = context;
  this->pipeline = pipeline;
  this->op = op;
  this->gstate = state_p;
  return;
}

Assistant:

HashAggregateFinalizeTask(ClientContext &context, Pipeline &pipeline, shared_ptr<Event> event_p,
	                          const PhysicalHashAggregate &op, HashAggregateGlobalSinkState &state_p)
	    : ExecutorTask(pipeline.executor, std::move(event_p)), context(context), pipeline(pipeline), op(op),
	      gstate(state_p) {
	}